

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Environment * __thiscall testing::UnitTest::AddEnvironment(UnitTest *this,Environment *env)

{
  vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *this_00;
  long in_FS_OFFSET;
  UnitTest *this_local;
  UnitTest *local_18;
  Environment *env_local;
  
  env_local = *(Environment **)(in_FS_OFFSET + 0x28);
  local_18 = (UnitTest *)env;
  if (env == (Environment *)0x0) {
    this_local = (UnitTest *)0x0;
  }
  else {
    this_00 = internal::UnitTestImpl::environments(this->impl_);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::push_back
              (this_00,(value_type *)&local_18);
    this_local = local_18;
  }
  if (*(Environment **)(in_FS_OFFSET + 0x28) == env_local) {
    return (Environment *)this_local;
  }
  __stack_chk_fail();
}

Assistant:

Environment* UnitTest::AddEnvironment(Environment* env) {
  if (env == NULL) {
    return NULL;
  }

  impl_->environments().push_back(env);
  return env;
}